

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kp_chrome_tracing.cpp
# Opt level: O3

void __thiscall KokkosTools::ChromeTracing::StackNode::print(StackNode *this,ostream *os)

{
  ostream *poVar1;
  
  std::__ostream_insert<char,std::char_traits<char>>(os,"{\"name\": \"",10);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     (os,(this->name)._M_dataplus._M_p,(this->name)._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\", \"cat\": \"",0xb);
  operator<<(poVar1,this->kind);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\", \"ph\": \"X",0xb);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\", \"ts\": \"",10);
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\", \"dur\": \"",0xb);
  std::chrono::_V2::system_clock::now();
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\", \"pid\": \"",0xb);
  poVar1 = (ostream *)std::ostream::operator<<((ostream *)poVar1,this->rank);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\", \"tid\": \"",0xb);
  poVar1 = (ostream *)std::ostream::operator<<((ostream *)poVar1,0);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\", \"args\": {\"dummy\": 1}}\n",0x19);
  return;
}

Assistant:

void print(std::ostream &os) const {
    // {"name": "Asub", "cat": "PERF", "ph": "B", "pid": 22630, "tid": 22630,
    // "ts": 829},
    os << "{\"name\": \"" << name << "\", \"cat\": \"" << kind
       << "\", \"ph\": \"X"
       << "\", \"ts\": \"" << start_time - base_time << "\", \"dur\": \""
       << now() - start_time << "\", \"pid\": \"" << rank << "\", \"tid\": \""
       << 0 << "\", \"args\": {\"dummy\": 1}}\n";
  }